

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxgeometsc.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *__return_storage_ptr__,soplex *this,
          SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *vecset,vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  *coScaleval,
          vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          *scaleval,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *epsilon)

{
  uint *puVar1;
  long lVar2;
  pointer pnVar3;
  bool bVar4;
  type_conflict5 tVar5;
  double *pdVar6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_00;
  long lVar7;
  long *plVar8;
  int j;
  long lVar9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_258;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_218;
  long local_210;
  soplex *local_208;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *local_200;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1f8;
  double local_1f0;
  cpp_dec_float<50U,_int,_void> local_1e8;
  cpp_dec_float<50U,_int,_void> local_1a8;
  pointer local_168;
  pointer pnStack_160;
  pointer local_158;
  pointer pnStack_150;
  pointer local_148;
  int local_140;
  bool local_13c;
  pointer local_138;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  lVar7 = 0;
  local_218 = __return_storage_ptr__;
  local_200 = coScaleval;
  local_1f8 = vecset;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&__return_storage_ptr__->m_backend,0.0,(type *)0x0);
  local_208 = this;
  do {
    if (*(int *)(local_208 + 0x38) <= lVar7) {
      return local_218;
    }
    plVar8 = (long *)((long)*(int *)(*(long *)(local_208 + 0x28) + 4 + lVar7 * 8) * 0x28 +
                     *(long *)(local_208 + 0x20));
    local_210 = lVar7;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_1a8,0.0,(type *)0x0);
    pdVar6 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_1e8,*pdVar6,(type *)0x0);
    lVar7 = 0;
    for (lVar9 = 0; lVar9 < *(int *)((long)plVar8 + 0xc); lVar9 = lVar9 + 1) {
      lVar2 = *plVar8;
      local_a8.fpclass = cpp_dec_float_finite;
      local_a8.prec_elem = 10;
      local_a8.data._M_elems[0] = 0;
      local_a8.data._M_elems[1] = 0;
      local_a8.data._M_elems[2] = 0;
      local_a8.data._M_elems[3] = 0;
      local_a8.data._M_elems[4] = 0;
      local_a8.data._M_elems[5] = 0;
      local_a8.data._M_elems._24_5_ = 0;
      local_a8.data._M_elems[7]._1_3_ = 0;
      local_a8.data._M_elems._32_5_ = 0;
      local_a8._37_8_ = 0;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_a8,(cpp_dec_float<50U,_int,_void> *)(lVar2 + lVar7),
                 (cpp_dec_float<50U,_int,_void> *)
                 ((local_1f8->
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  )._vptr_ClassArray + (ulong)*(uint *)(lVar2 + 0x38 + lVar7) * 7));
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((type *)&local_258,(multiprecision *)&local_a8,arg);
      local_128.m_backend.data._M_elems[9]._1_3_ = local_258.data._M_elems[9]._1_3_;
      local_128.m_backend.data._M_elems._32_5_ = local_258.data._M_elems._32_5_;
      local_128.m_backend.data._M_elems[7]._1_3_ = local_258.data._M_elems[7]._1_3_;
      local_128.m_backend.data._M_elems._24_5_ = local_258.data._M_elems._24_5_;
      local_128.m_backend.data._M_elems[4] = local_258.data._M_elems[4];
      local_128.m_backend.data._M_elems[5] = local_258.data._M_elems[5];
      local_128.m_backend.data._M_elems[0] = local_258.data._M_elems[0];
      local_128.m_backend.data._M_elems[1] = local_258.data._M_elems[1];
      local_128.m_backend.data._M_elems[2] = local_258.data._M_elems[2];
      local_128.m_backend.data._M_elems[3] = local_258.data._M_elems[3];
      local_128.m_backend.exp = local_258.exp;
      local_128.m_backend.neg = local_258.neg;
      local_128.m_backend.fpclass = local_258.fpclass;
      local_128.m_backend.prec_elem = local_258.prec_elem;
      local_168 = (scaleval->
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      pnStack_160 = (scaleval->
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
      local_158 = (scaleval->
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage;
      pnStack_150 = scaleval[1].
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_148 = scaleval[1].
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      local_140 = *(int *)&scaleval[1].
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_13c = *(bool *)((long)&scaleval[1].
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
      local_138 = scaleval[2].
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      bVar4 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_128,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_168);
      if (!bVar4) {
        tVar5 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_258,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_1a8);
        if (tVar5) {
          local_1a8.data._M_elems[9]._1_3_ = local_258.data._M_elems[9]._1_3_;
          local_1a8.data._M_elems._32_5_ = local_258.data._M_elems._32_5_;
          local_1a8.data._M_elems[7]._1_3_ = local_258.data._M_elems[7]._1_3_;
          local_1a8.data._M_elems._24_5_ = local_258.data._M_elems._24_5_;
          local_1a8.data._M_elems[4] = local_258.data._M_elems[4];
          local_1a8.data._M_elems[5] = local_258.data._M_elems[5];
          local_1a8.data._M_elems[0] = local_258.data._M_elems[0];
          local_1a8.data._M_elems[1] = local_258.data._M_elems[1];
          local_1a8.data._M_elems[2] = local_258.data._M_elems[2];
          local_1a8.data._M_elems[3] = local_258.data._M_elems[3];
          local_1a8.exp = local_258.exp;
          local_1a8.neg = local_258.neg;
          local_1a8.fpclass = local_258.fpclass;
          local_1a8.prec_elem = local_258.prec_elem;
        }
        tVar5 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_258,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_1e8);
        if (tVar5) {
          local_1e8.data._M_elems[9]._1_3_ = local_258.data._M_elems[9]._1_3_;
          local_1e8.data._M_elems._32_5_ = local_258.data._M_elems._32_5_;
          local_1e8.data._M_elems[7]._1_3_ = local_258.data._M_elems[7]._1_3_;
          local_1e8.data._M_elems._24_5_ = local_258.data._M_elems._24_5_;
          local_1e8.data._M_elems[4] = local_258.data._M_elems[4];
          local_1e8.data._M_elems[5] = local_258.data._M_elems[5];
          local_1e8.data._M_elems[0] = local_258.data._M_elems[0];
          local_1e8.data._M_elems[1] = local_258.data._M_elems[1];
          local_1e8.data._M_elems[2] = local_258.data._M_elems[2];
          local_1e8.data._M_elems[3] = local_258.data._M_elems[3];
          local_1e8.exp = local_258.exp;
          local_1e8.neg = local_258.neg;
          local_1e8.fpclass = local_258.fpclass;
          local_1e8.prec_elem = local_258.prec_elem;
        }
      }
      lVar7 = lVar7 + 0x3c;
    }
    pdVar6 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_258,*pdVar6,(type *)0x0);
    bVar4 = boost::multiprecision::operator==
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_1e8,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_258);
    if (bVar4) {
LAB_0012f14e:
      lVar7 = local_210;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_1e8,1.0);
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_1a8,1.0);
    }
    else {
      local_68.data._M_elems[0] = 0;
      local_68.data._M_elems[1] = 0;
      tVar5 = boost::multiprecision::operator==
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_1a8,(double *)&local_68);
      lVar7 = local_210;
      if (tVar5) goto LAB_0012f14e;
    }
    local_1f0 = 1.0;
    local_e8.fpclass = cpp_dec_float_finite;
    local_e8.prec_elem = 10;
    local_e8.data._M_elems[0] = 0;
    local_e8.data._M_elems[1] = 0;
    local_e8.data._M_elems[2] = 0;
    local_e8.data._M_elems[3] = 0;
    local_e8.data._M_elems[4] = 0;
    local_e8.data._M_elems[5] = 0;
    local_e8.data._M_elems._24_5_ = 0;
    local_e8.data._M_elems[7]._1_3_ = 0;
    local_e8.data._M_elems._32_5_ = 0;
    local_e8._37_8_ = 0;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_e8,&local_1e8,&local_1a8);
    boost::multiprecision::sqrt<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              ((type *)&local_68,(multiprecision *)&local_e8,arg_00);
    local_258.fpclass = cpp_dec_float_finite;
    local_258.prec_elem = 10;
    local_258.data._M_elems[0] = 0;
    local_258.data._M_elems[1] = 0;
    local_258.data._M_elems[2] = 0;
    local_258.data._M_elems[3] = 0;
    local_258.data._M_elems[4] = 0;
    local_258.data._M_elems[5] = 0;
    local_258.data._M_elems._24_5_ = 0;
    local_258.data._M_elems[7]._1_3_ = 0;
    local_258.data._M_elems._32_5_ = 0;
    local_258.data._M_elems[9]._1_3_ = 0;
    local_258.exp = 0;
    local_258.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
              (&local_258,&local_1f0,&local_68);
    pnVar3 = (local_200->
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    *(ulong *)((long)pnVar3[lVar7].m_backend.data._M_elems + 0x20) =
         CONCAT35(local_258.data._M_elems[9]._1_3_,local_258.data._M_elems._32_5_);
    puVar1 = (uint *)((long)pnVar3[lVar7].m_backend.data._M_elems + 0x10);
    *(undefined8 *)puVar1 = local_258.data._M_elems._16_8_;
    *(ulong *)(puVar1 + 2) =
         CONCAT35(local_258.data._M_elems[7]._1_3_,local_258.data._M_elems._24_5_);
    *(undefined8 *)pnVar3[lVar7].m_backend.data._M_elems = local_258.data._M_elems._0_8_;
    *(undefined8 *)((long)pnVar3[lVar7].m_backend.data._M_elems + 8) = local_258.data._M_elems._8_8_
    ;
    pnVar3[lVar7].m_backend.exp = local_258.exp;
    pnVar3[lVar7].m_backend.neg = local_258.neg;
    pnVar3[lVar7].m_backend.fpclass = local_258.fpclass;
    pnVar3[lVar7].m_backend.prec_elem = local_258.prec_elem;
    local_258.fpclass = cpp_dec_float_finite;
    local_258.prec_elem = 10;
    local_258.data._M_elems[0] = 0;
    local_258.data._M_elems[1] = 0;
    local_258.data._M_elems[2] = 0;
    local_258.data._M_elems[3] = 0;
    local_258.data._M_elems[4] = 0;
    local_258.data._M_elems[5] = 0;
    local_258.data._M_elems._24_5_ = 0;
    local_258.data._M_elems[7]._1_3_ = 0;
    local_258.data._M_elems._32_5_ = 0;
    local_258.data._M_elems[9]._1_3_ = 0;
    local_258.exp = 0;
    local_258.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_258,&local_1a8,&local_1e8);
    tVar5 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_258,local_218);
    if (tVar5) {
      *(ulong *)((local_218->m_backend).data._M_elems + 8) =
           CONCAT35(local_258.data._M_elems[9]._1_3_,local_258.data._M_elems._32_5_);
      *(undefined8 *)((local_218->m_backend).data._M_elems + 4) = local_258.data._M_elems._16_8_;
      *(ulong *)((local_218->m_backend).data._M_elems + 6) =
           CONCAT35(local_258.data._M_elems[7]._1_3_,local_258.data._M_elems._24_5_);
      *(undefined8 *)(local_218->m_backend).data._M_elems = local_258.data._M_elems._0_8_;
      *(undefined8 *)((local_218->m_backend).data._M_elems + 2) = local_258.data._M_elems._8_8_;
      (local_218->m_backend).exp = local_258.exp;
      (local_218->m_backend).neg = local_258.neg;
      (local_218->m_backend).fpclass = local_258.fpclass;
      (local_218->m_backend).prec_elem = local_258.prec_elem;
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

static R computeScalingVec(
   const SVSetBase<R>*   vecset, const std::vector<R>& coScaleval,
   std::vector<R>&       scaleval, R epsilon)
{
   R pmax = 0.0;

   assert(scaleval.size() == unsigned(vecset->num()));

   for(int i = 0; i < vecset->num(); ++i)
   {
      const SVectorBase<R>& vec = (*vecset)[i];

      R maxi = 0.0;
      R mini = R(infinity);

      for(int j = 0; j < vec.size(); ++j)
      {
         const R x = spxAbs(vec.value(j) * coScaleval[unsigned(vec.index(j))]);

         if(!isZero(x, epsilon))
         {
            if(x > maxi)
               maxi = x;

            if(x < mini)
               mini = x;
         }
      }

      // empty rows/cols are possible
      if(mini == R(infinity) || maxi == 0.0)
      {
         mini = 1.0;
         maxi = 1.0;
      }

      assert(mini < R(infinity));
      assert(maxi > 0.0);

      scaleval[unsigned(i)] = 1.0 / spxSqrt(mini * maxi);

      const R p = maxi / mini;

      if(p > pmax)
         pmax = p;
   }

   return pmax;
}